

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

FuncInfo * __thiscall
ByteCodeGenerator::StartBindGlobalStatements(ByteCodeGenerator *this,ParseNodeProg *pnode)

{
  undefined1 *puVar1;
  int iVar2;
  Scope *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  FunctionBody *pFVar7;
  FuncInfo *this_00;
  
  if (this->parentScopeInfo == (ScopeInfo *)0x0) {
    pSVar3 = (pnode->super_ParseNodeFnc).scope;
    this->currentScope = pSVar3;
    if (pSVar3 == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x464,"(currentScope)","currentScope");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    this->globalScope = this->currentScope;
  }
  else {
    this->trackEnvDepth = true;
    RestoreScopeInfo(this,this->parentScopeInfo,(FuncInfo *)0x0);
    this->trackEnvDepth = false;
  }
  bVar5 = Js::ScriptContext::IsScriptContextInNonDebugMode(this->scriptContext);
  if ((((!bVar5) && ((this->m_utf8SourceInfo->field_0xa8 & 4) == 0)) &&
      (pFVar7 = this->pCurrentFunction, pFVar7 != (FunctionBody *)0x0)) &&
     (((pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 0x10) != 0)) {
    bVar5 = Js::ParseableFunctionInfo::IsFakeGlobalFunc
                      (&pFVar7->super_ParseableFunctionInfo,this->flags);
    if (!bVar5) {
      pFVar7 = this->pCurrentFunction;
      Js::FunctionBody::RemoveDeferParseAttribute(pFVar7);
      Js::FunctionBody::ResetByteCodeGenVisitState(pFVar7);
      goto LAB_0082f925;
    }
  }
  if ((this->flags & 0x800000) == 0) {
    pFVar7 = MakeGlobalFunctionBody(this,(ParseNode *)pnode);
    puVar1 = &(pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.field_0x44;
    *puVar1 = *puVar1 | 2;
    if (((pnode->super_ParseNodeFnc).fncFlags & kFunctionStrictMode) != kFunctionNone) {
      puVar1 = &(pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
      *puVar1 = *puVar1 | 1;
    }
  }
  else {
    pFVar7 = EnsureFakeGlobalFuncForUndefer(this,(ParseNode *)pnode);
  }
LAB_0082f925:
  if (((pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) == 0) {
    Js::FunctionBody::SaveState(pFVar7,&pnode->super_ParseNodeFnc);
  }
  else {
    Js::FunctionBody::RestoreState(pFVar7,&pnode->super_ParseNodeFnc);
  }
  this_00 = (FuncInfo *)new<Memory::ArenaAllocator>(0x300,this->alloc,0x366bee);
  FuncInfo::FuncInfo(this_00,L"glo",this->alloc,this,(Scope *)0x0,this->globalScope,
                     &pnode->super_ParseNodeFnc,&pFVar7->super_ParseableFunctionInfo);
  iVar2 = (pnode->super_ParseNodeFnc).astSize;
  if (this->maxAstSize < iVar2) {
    this->maxAstSize = iVar2;
  }
  PushFuncInfo(this,L"StartBindGlobalStatements",this_00);
  return this_00;
}

Assistant:

FuncInfo * ByteCodeGenerator::StartBindGlobalStatements(ParseNodeProg *pnode)
{
    if (parentScopeInfo)
    {
        trackEnvDepth = true;
        RestoreScopeInfo(parentScopeInfo, nullptr);
        trackEnvDepth = false;
        // "currentScope" is the parentFunc scope. This ensures the deferred func declaration
        // symbol will bind to the func declaration symbol already available in parentFunc scope.
    }
    else
    {
        currentScope = pnode->scope;
        Assert(currentScope);
        globalScope = currentScope;
    }

    Js::FunctionBody * byteCodeFunction;

    if (!IsInNonDebugMode() && this->pCurrentFunction != nullptr && this->pCurrentFunction->GetIsGlobalFunc() && !this->pCurrentFunction->IsFakeGlobalFunc(flags))
    {
        // we will re-use the global FunctionBody which was created before deferred parse.
        byteCodeFunction = this->pCurrentFunction;
        byteCodeFunction->RemoveDeferParseAttribute();
        byteCodeFunction->ResetByteCodeGenVisitState();
    }
    else if ((this->flags & fscrDeferredFnc))
    {
        byteCodeFunction = this->EnsureFakeGlobalFuncForUndefer(pnode);
    }
    else
    {
        byteCodeFunction = this->MakeGlobalFunctionBody(pnode);

        // Mark this global function to required for register script event
        byteCodeFunction->SetIsTopLevel(true);

        if (pnode->GetStrictMode() != 0)
        {
            byteCodeFunction->SetIsStrictMode();
        }
    }
    if (byteCodeFunction->IsReparsed())
    {
        byteCodeFunction->RestoreState(pnode);
    }
    else
    {
        byteCodeFunction->SaveState(pnode);
    }

    FuncInfo *funcInfo = Anew(alloc, FuncInfo, Js::Constants::GlobalFunction,
        alloc, this, nullptr, globalScope, pnode, byteCodeFunction);

    int32 currentAstSize = pnode->astSize;
    if (currentAstSize > this->maxAstSize)
    {
        this->maxAstSize = currentAstSize;
    }
    PushFuncInfo(_u("StartBindGlobalStatements"), funcInfo);

    return funcInfo;
}